

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# badfp.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  code **local_38;
  void *addr;
  
  local_38 = (code **)0x0;
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"dh");
      if (iVar1 != 100) break;
      local_38 = (code **)&local_38;
    }
    if (iVar1 != 0x68) break;
    signal(0xb,sighandle);
  }
  if (iVar1 == -1) {
    (*(code *)local_38)();
    return 0;
  }
  abort();
}

Assistant:

int
main(int argc, char *argv[])
{
   int c;
   void *addr = 0;
   while ((c = getopt(argc, argv, "dh")) != -1) {
      switch (c) {
         case 'h': // handle the fault with a signal handler.
            signal(SIGSEGV, sighandle);
            break;
         case 'd': // handle the fault with a signal handler.
            addr = &addr;
            break;
         default:
            abort();
      }
   }

   void (*f)(void) = addr;
   f();
}